

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_neutralize(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  CHAR_DATA *in_RCX;
  CHAR_DATA *in_RDX;
  __type_conflict2 _Var2;
  AFFECT_DATA af;
  CHAR_DATA *victim;
  AFFECT_DATA *in_stack_ffffffffffffff68;
  CHAR_DATA *in_stack_ffffffffffffff70;
  CHAR_DATA *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  ulong local_68 [2];
  undefined4 local_58;
  CHAR_DATA *local_28;
  CHAR_DATA *local_10;
  
  local_28 = in_RCX;
  local_10 = in_RDX;
  bVar1 = is_affected(in_RCX,(int)gsn_neutralize);
  if (bVar1) {
    act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
        in_stack_ffffffffffffff68,0);
  }
  else {
    send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
        in_stack_ffffffffffffff68,0);
    init_affect((AFFECT_DATA *)0x6e236f);
    local_58 = 0;
    if (local_28 == local_10) {
      _Var2 = std::pow<int,int>(0,0x6e23d9);
      local_68[0] = (long)_Var2 | local_68[0];
      affect_to_char(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      zero_vector((long *)local_68);
      _Var2 = std::pow<int,int>(0,0x6e2414);
      local_68[0] = (long)_Var2 | local_68[0];
      local_58 = 5;
    }
    else {
      _Var2 = std::pow<int,int>(0,0x6e244a);
      local_68[0] = (long)_Var2 | local_68[0];
    }
    affect_to_char(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  return;
}

Assistant:

void spell_neutralize(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (is_affected(victim, gsn_neutralize))
	{
		act("$N is already neutralized.", ch, 0, victim, TO_CHAR);
		return;
	}

	send_to_char("Your body becomes tempered against acids.\n\r", victim);
	act("$n's skin flushes slightly green for a moment, then returns to normal.", victim, 0, 0, TO_ROOM);

	init_affect(&af);
	af.where = TO_IMMUNE;
	af.aftype = AFT_SPELL;
	af.type = gsn_neutralize;
	af.level = level;
	af.duration = level / 3;
	af.modifier = 0;
	af.location = 0;

	if (victim == ch)
	{
		SET_BIT(af.bitvector, IMM_ACID);
		affect_to_char(victim, &af);

		zero_vector(af.bitvector);

		SET_BIT(af.bitvector, RES_POISON);
		af.where = TO_RESIST;
		af.aftype = AFT_INVIS;
	}
	else
	{
		af.where = TO_RESIST;
		SET_BIT(af.bitvector, RES_ACID);
	}

	af.mod_name = MOD_RESISTANCE;
	affect_to_char(victim, &af);
}